

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::disconnect
          (RpcConnectionState *this,Exception *exception)

{
  uint *puVar1;
  int line;
  uint uVar2;
  char *file;
  ulong uVar3;
  SourceLocation location;
  Disposer *node;
  Connection *pCVar4;
  PromiseBase node_00;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_class_16_2_189108fc *func;
  anon_class_24_3_4d11cdf1 *extraout_RDX;
  anon_class_24_3_4d11cdf1 *extraout_RDX_00;
  anon_class_24_3_4d11cdf1 *extraout_RDX_01;
  anon_class_24_3_4d11cdf1 *extraout_RDX_02;
  anon_class_24_3_4d11cdf1 *func_00;
  Exception *pEVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> dyingConnection;
  Canceler *ptrCopy;
  String result;
  Exception networkException;
  Promise<void> shutdownPromise;
  Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> local_710;
  Connection *local_700;
  Canceler *local_6f8;
  PromiseBase local_6f0;
  undefined1 local_6e8 [56];
  char *local_6b0;
  char *pcStack_6a8;
  ArrayDisposer *local_6a0;
  undefined1 local_698 [16];
  undefined1 auStack_688 [40];
  ArrayDisposer *pAStack_660;
  ArrayDisposer *local_658;
  Context *pCStack_650;
  Context *local_648;
  Context *pCStack_640;
  ArrayDisposer *local_638;
  ArrayDisposer *local_630;
  ArrayDisposer *local_628;
  undefined1 local_620 [256];
  RemoveConst<kj::Exception::Detail> *local_520;
  Detail *pDStack_518;
  Detail *local_510;
  Detail *pDStack_508;
  ArrayDisposer *local_500;
  undefined1 local_4f0 [80];
  char *local_4a0;
  Exception *pEStack_498;
  RpcConnectionState *local_490;
  Maybe<kj::Exception> local_360;
  Maybe<kj::Exception> local_1c8;
  
  if ((this->connection).tag == 1) {
    sVar9 = (exception->description).content.size_;
    if (sVar9 == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (exception->description).content.ptr;
    }
    file = exception->file;
    line = exception->line;
    kj::heapString((String *)(local_6e8 + 0x20),pcVar10,(sVar9 - 1) + (ulong)(sVar9 == 0));
    kj::Exception::Exception
              ((Exception *)local_4f0,DISCONNECTED,file,line,(String *)(local_6e8 + 0x20));
    uVar6 = local_6e8._40_8_;
    uVar5 = local_6e8._32_8_;
    if ((ArrayDisposer *)local_6e8._32_8_ != (ArrayDisposer *)0x0) {
      local_6e8._32_8_ = (ArrayDisposer *)0x0;
      local_6e8._40_8_ = (char *)0x0;
      (*(code *)**(undefined8 **)local_6e8._48_8_)(local_6e8._48_8_,uVar5,1,uVar6,uVar6,0);
    }
    uVar3 = (exception->remoteTrace).content.size_;
    if (uVar3 == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (exception->remoteTrace).content.ptr;
    }
    if (1 < uVar3) {
      sVar9 = uVar3 - 1;
      kj::heapString((String *)local_698,sVar9);
      if (sVar9 != 0) {
        pEVar7 = (Exception *)local_698._8_8_;
        if ((Exception *)local_698._8_8_ != (Exception *)0x0) {
          pEVar7 = (Exception *)local_698._0_8_;
        }
        memcpy(pEVar7,pcVar10,sVar9);
      }
      pEVar7 = pEStack_498;
      pcVar10 = local_4a0;
      if ((Exception *)local_4a0 != (Exception *)0x0) {
        local_4a0 = (char *)0x0;
        pEStack_498 = (Exception *)0x0;
        (**(local_490->super_ErrorHandler)._vptr_ErrorHandler)(local_490,pcVar10,1,pEVar7,pEVar7,0);
      }
      local_4a0 = (char *)local_698._0_8_;
      pEStack_498 = (Exception *)local_698._8_8_;
      local_490 = (RpcConnectionState *)auStack_688._0_8_;
    }
    uVar2 = exception->traceCount;
    if ((ulong)uVar2 != 0) {
      lVar8 = 0;
      do {
        kj::Exception::addTrace((Exception *)local_4f0,*(void **)((long)exception->trace + lVar8));
        lVar8 = lVar8 + 8;
      } while ((ulong)uVar2 << 3 != lVar8);
    }
    kj::Exception::addTraceHere((Exception *)local_4f0);
    local_6e8._24_8_ = *(undefined8 *)&(this->connection).field_1;
    local_710.ptr = *(Connection **)((long)&(this->connection).field_1 + 8);
    local_700 = *(Connection **)((long)&(this->connection).field_1 + 0x10);
    *(undefined8 *)((long)&(this->connection).field_1 + 0x10) = 0;
    local_6e8._16_8_ = *(undefined8 *)((long)&(this->connection).field_1 + 0x18);
    local_6f8 = *(Canceler **)((long)&(this->connection).field_1 + 0x20);
    *(undefined8 *)((long)&(this->connection).field_1 + 0x20) = 0;
    kj::Exception::Exception((Exception *)local_698,(Exception *)local_4f0);
    kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception>::
    init<kj::Exception,kj::Exception>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception> *)
               &this->connection,(Exception *)local_698);
    kj::Exception::~Exception((Exception *)local_698);
    local_6e8._0_8_ = this;
    local_6e8._8_8_ = (RpcConnectionState *)local_4f0;
    kj::
    runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_2_>
              (&local_360,(kj *)local_6e8,func);
    local_698[0] = (kj)local_360.ptr.isSet;
    func_00 = extraout_RDX;
    if (local_360.ptr.isSet == true) {
      local_698._8_8_ = local_360.ptr.field_1.value.ownFile.content.ptr;
      auStack_688._0_8_ = local_360.ptr.field_1.value.ownFile.content.size_;
      auStack_688._8_8_ = local_360.ptr.field_1.value.ownFile.content.disposer;
      local_360.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_360.ptr.field_1.value.ownFile.content.size_ = 0;
      auStack_688._16_8_ = local_360.ptr.field_1.value.file;
      auStack_688._24_8_ = local_360.ptr.field_1._32_8_;
      auStack_688._32_8_ = local_360.ptr.field_1.value.description.content.ptr;
      pAStack_660 = (ArrayDisposer *)local_360.ptr.field_1.value.description.content.size_;
      local_658 = local_360.ptr.field_1.value.description.content.disposer;
      pCStack_650 = (Context *)local_360.ptr.field_1.value.context.ptr.disposer;
      local_360.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_360.ptr.field_1.value.description.content.size_ = 0;
      local_648 = local_360.ptr.field_1.value.context.ptr.ptr;
      pCStack_640 = (Context *)local_360.ptr.field_1.value.remoteTrace.content.ptr;
      local_360.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      local_638 = (ArrayDisposer *)local_360.ptr.field_1.value.remoteTrace.content.size_;
      local_630 = local_360.ptr.field_1.value.remoteTrace.content.disposer;
      local_360.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
      local_360.ptr.field_1.value.remoteTrace.content.size_ = 0;
      memcpy(&local_628,(undefined1 *)((long)&local_360.ptr.field_1.value + 0x68),0x105);
      local_520 = local_360.ptr.field_1.value.details.builder.ptr;
      pDStack_518 = local_360.ptr.field_1.value.details.builder.pos;
      local_510 = local_360.ptr.field_1.value.details.builder.endPtr;
      pDStack_508 = (Detail *)local_360.ptr.field_1.value.details.builder.disposer;
      local_360.ptr.field_1.value.details.builder.ptr = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_360.ptr.field_1.value.details.builder.pos = (Detail *)0x0;
      local_360.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
      kj::Exception::~Exception((Exception *)&local_360.ptr.field_1);
      func_00 = extraout_RDX_00;
    }
    if ((local_698[0] == (kj)0x1) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[71],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x229,ERROR,
                 "\"Uncaught exception when destroying capabilities dropped by disconnect.\", newException"
                 ,(char (*) [71])
                  "Uncaught exception when destroying capabilities dropped by disconnect.",
                 (Exception *)(local_698 + 8));
      func_00 = extraout_RDX_01;
    }
    if (local_698[0] == (kj)0x1) {
      kj::Exception::~Exception((Exception *)(local_698 + 8));
      func_00 = extraout_RDX_02;
    }
    if (this->idle == false) {
      local_698._0_8_ = &local_710.ptr;
      local_698._8_8_ = exception;
      auStack_688._0_8_ = this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_3_>
                (&local_1c8,(kj *)local_698,func_00);
      if (local_1c8.ptr.isSet == true) {
        kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
      }
    }
    pCVar4 = local_700;
    (*local_700->_vptr_Connection[2])(&local_710,local_700);
    kj::Promise<void>::attach<kj::Own<capnp::_::VatNetworkBase::Connection,decltype(nullptr)>>
              ((Promise<void> *)local_6e8,&local_710);
    local_698._0_8_ = &this->super_Refcounted;
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    auStack_688._0_8_ = (exception->ownFile).content.ptr;
    auStack_688._8_8_ = (exception->ownFile).content.size_;
    auStack_688._16_8_ = (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    auStack_688._24_8_ = exception->file;
    auStack_688._32_8_ = *(undefined8 *)&exception->line;
    pAStack_660 = (ArrayDisposer *)(exception->description).content.ptr;
    local_658 = (ArrayDisposer *)(exception->description).content.size_;
    pCStack_650 = (Context *)(exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_648 = (Context *)(exception->context).ptr.disposer;
    pCStack_640 = (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_638 = (ArrayDisposer *)(exception->remoteTrace).content.ptr;
    local_630 = (ArrayDisposer *)(exception->remoteTrace).content.size_;
    local_628 = (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    local_698._8_8_ = this;
    memcpy(local_620,exception->trace,0x105);
    pDStack_518 = (exception->details).builder.ptr;
    local_510 = (exception->details).builder.pos;
    pDStack_508 = (exception->details).builder.endPtr;
    local_500 = (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_6b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++";
    pcStack_6a8 = "disconnect";
    local_6a0 = (ArrayDisposer *)0x1c00000239;
    location.function = "disconnect";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
    ;
    location.lineNumber = 0x239;
    location.columnNumber = 0x1c;
    kj::Promise<void>::
    catch_<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)&local_360,(anon_class_416_2_7e3683e4_for_errorHandler *)local_6e8,
               location);
    kj::Exception::~Exception((Exception *)auStack_688);
    uVar5 = local_698._8_8_;
    if ((RpcConnectionState *)local_698._8_8_ != (RpcConnectionState *)0x0) {
      local_698._8_8_ = (RpcConnectionState *)0x0;
      (**((Disposer *)local_698._0_8_)->_vptr_Disposer)
                (local_698._0_8_,
                 (_func_int *)
                 ((long)&((ErrorHandler *)uVar5)->_vptr_ErrorHandler +
                 (long)((ErrorHandler *)uVar5)->_vptr_ErrorHandler[-2]));
    }
    uVar5 = local_6e8._0_8_;
    if ((PromiseNode *)local_6e8._0_8_ != (PromiseNode *)0x0) {
      local_6e8._0_8_ = (RpcConnectionState *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
    }
    node = local_710.disposer;
    if ((PromiseArenaMember *)local_710.disposer != (PromiseArenaMember *)0x0) {
      local_710.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    kj::Canceler::cancel(local_6f8,(Exception *)local_4f0);
    local_6f0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_360.ptr._0_8_;
    local_360.ptr._0_8_ = (PromiseArenaMember *)0x0;
    dropConnection((Impl *)local_6e8._24_8_,pCVar4,(Promise<void> *)&local_6f0);
    node_00.node.ptr = local_6f0.node.ptr;
    if (local_6f0.node.ptr != (PromiseNode *)0x0) {
      local_6f0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
    }
    uVar5 = local_360.ptr._0_8_;
    if ((PromiseArenaMember *)local_360.ptr._0_8_ != (PromiseArenaMember *)0x0) {
      local_360.ptr._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
    }
    (*(code *)**(undefined8 **)local_6e8._16_8_)(local_6e8._16_8_,local_6f8);
    pCVar4 = local_700;
    if (local_700 != (Connection *)0x0) {
      local_700 = (Connection *)0x0;
      (**(local_710.ptr)->_vptr_Connection)
                (local_710.ptr,
                 (_func_int *)((long)&pCVar4->_vptr_Connection + (long)pCVar4->_vptr_Connection[-2])
                );
    }
    kj::Exception::~Exception((Exception *)local_4f0);
  }
  (this->traceEncoder).ptr = (Function<kj::String_(const_kj::Exception_&)> *)0x0;
  return;
}

Assistant:

void disconnect(kj::Exception&& exception) {
    // Shut down the connection with the given error.
    //
    // This will cancel `tasks`, so cannot be called from inside a task in `tasks`. Instead, use
    // `tasks.add(exception)` to schedule a shutdown, since any error thrown by a task will be
    // passed to `disconnect()` later.

    // After disconnect(), the RpcSystem could be destroyed, making `traceEncoder` a dangling
    // reference, so null it out before we return from here. We don't need it anymore once
    // disconnected anyway.
    KJ_DEFER(traceEncoder = kj::none);

    if (!connection.is<Connected>()) {
      // Already disconnected.
      return;
    }

    kj::Exception networkException(kj::Exception::Type::DISCONNECTED,
        exception.getFile(), exception.getLine(), kj::heapString(exception.getDescription()));

    // Don't throw away the stack trace.
    if (exception.getRemoteTrace() != nullptr) {
      networkException.setRemoteTrace(kj::str(exception.getRemoteTrace()));
    }
    for (void* addr: exception.getStackTrace()) {
      networkException.addTrace(addr);
    }
    // If your stack trace points here, it means that the exception became the reason that the
    // RPC connection was disconnected. The exception was then thrown by all in-flight calls and
    // all future calls on this connection.
    networkException.addTraceHere();

    // Set our connection state to Disconnected now so that no one tries to write any messages to
    // it in their destructors.
    auto& rpcSystem = connection.get<Connected>().rpcSystem;
    auto dyingConnection = kj::mv(connection.get<Connected>().connection);
    auto canceler = kj::mv(connection.get<Connected>().canceler);
    connection.init<Disconnected>(kj::cp(networkException));

    KJ_IF_SOME(newException, kj::runCatchingExceptions([&]() {
      // Carefully pull all the objects out of the tables prior to releasing them because their
      // destructors could come back and mess with the tables.
      kj::Vector<kj::Own<PipelineHook>> pipelinesToRelease;
      kj::Vector<kj::Own<ClientHook>> clientsToRelease;
      kj::Vector<decltype(Answer::task)> tasksToRelease;
      kj::Vector<kj::Promise<void>> resolveOpsToRelease;
      KJ_DEFER(tasks.clear());

      // All current questions complete with exceptions.
      questions.forEach([&](QuestionId id, Question& question) {
        KJ_IF_SOME(questionRef, question.selfRef) {
          // QuestionRef still present.
          questionRef.reject(kj::cp(networkException));

          // We need to fully disconnect each QuestionRef otherwise it holds a reference back to
          // the connection state. Meanwhile `tasks` may hold streaming calls that end up holding
          // these QuestionRefs. Technically this is a cyclic reference, but as long as the cycle
          // is broken on disconnect (which happens when the RpcSystem itself is destroyed), then
          // we're OK.
          questionRef.disconnect();
        }
      });
      // Since we've disconnected the QuestionRefs, they won't clean up the questions table for
      // us, so do that here.
      questions.release();

      answers.forEach([&](AnswerId id, Answer& answer) {
        KJ_IF_SOME(p, answer.pipeline) {
          pipelinesToRelease.add(kj::mv(p));
        }

        tasksToRelease.add(kj::mv(answer.task));

        KJ_IF_SOME(context, answer.callContext) {
          context.finish();
        }
      });

      exports.forEach([&](ExportId id, Export& exp) {
        clientsToRelease.add(kj::mv(exp.clientHook));
        KJ_IF_SOME(op, exp.resolveOp) {
          resolveOpsToRelease.add(kj::mv(op));
        }
        exp = Export();
      });

      imports.forEach([&](ImportId id, Import& import) {
        KJ_IF_SOME(f, import.promiseFulfiller) {
          f->reject(kj::cp(networkException));
        }
      });

      embargoes.forEach([&](EmbargoId id, Embargo& embargo) {
        KJ_IF_SOME(f, embargo.fulfiller) {
          f->reject(kj::cp(networkException));
        }
      });
    })) {
      // Some destructor must have thrown an exception.  There is no appropriate place to report
      // these errors.
      KJ_LOG(ERROR, "Uncaught exception when destroying capabilities dropped by disconnect.",
             newException);
    }

    // Send an abort message, but ignore failure. Don't send if idle, because we promised not to
    // send any more messages in that case... we'll just disconnect.
    if (!idle) {
      kj::runCatchingExceptions([&]() {
        auto message = dyingConnection->newOutgoingMessage(
            messageSizeHint<void>() + exceptionSizeHint(exception));
        fromException(exception, message->getBody().getAs<rpc::Message>().initAbort());
        message->send();
      });
    }

    // Indicate disconnect.
    auto& dyingConnectionRef = *dyingConnection;
    auto shutdownPromise = dyingConnection->shutdown()
        .attach(kj::mv(dyingConnection))
        .catch_([self = kj::addRef(*this), origException = kj::mv(exception)](
                  kj::Exception&& shutdownException) -> kj::Promise<void> {
          // Don't report disconnects as an error.
          if (shutdownException.getType() == kj::Exception::Type::DISCONNECTED) {
            return kj::READY_NOW;
          }
          // If the error is just what was passed in to disconnect(), don't report it back out
          // since it shouldn't be anything the caller doesn't already know about.
          if (shutdownException.getType() == origException.getType() &&
              shutdownException.getDescription() == origException.getDescription()) {
            return kj::READY_NOW;
          }
          // We are shutting down after receive error, ignore shutdown exception since underlying
          // transport is probably broken.
          if (self->receiveIncomingMessageError) {
            return kj::READY_NOW;
          }
          return kj::mv(shutdownException);
        });
    canceler->cancel(networkException);
    RpcSystemBase::dropConnection(rpcSystem, dyingConnectionRef, kj::mv(shutdownPromise));
  }